

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * Cudd_bddCompose(DdManager *dd,DdNode *f,DdNode *g,int v)

{
  DdNode *proj;
  DdNode *pDVar1;
  
  if (v < 0) {
    return (DdNode *)0x0;
  }
  if (v < dd->size) {
    proj = dd->vars[(uint)v];
    do {
      dd->reordered = 0;
      pDVar1 = cuddBddComposeRecur(dd,f,g,proj);
    } while (dd->reordered == 1);
  }
  else {
    pDVar1 = (DdNode *)0x0;
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddCompose(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  int  v)
{
    DdNode *proj, *res;

    /* Sanity check. */
    if (v < 0 || v >= dd->size) return(NULL);

    proj =  dd->vars[v];
    do {
        dd->reordered = 0;
        res = cuddBddComposeRecur(dd,f,g,proj);
    } while (dd->reordered == 1);
    return(res);

}